

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_predictor_4x8_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  int iVar15;
  undefined1 auVar16 [16];
  
  uVar1 = *(ulong *)above;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._12_2_ = (short)(uVar1 >> 0x30);
  auVar9._8_2_ = (short)(uVar1 >> 0x20);
  auVar9._0_8_ = uVar1;
  auVar9._10_4_ = auVar6._10_4_;
  auVar12._6_8_ = 0;
  auVar12._0_6_ = auVar9._8_6_;
  uVar2 = *(ulong *)left;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4._12_2_ = (short)(uVar2 >> 0x30);
  auVar7._8_2_ = (short)(uVar2 >> 0x20);
  auVar7._0_8_ = uVar2;
  auVar7._10_4_ = auVar4._10_4_;
  auVar13._6_8_ = 0;
  auVar13._0_6_ = auVar7._8_6_;
  auVar10._4_2_ = (short)(uVar2 >> 0x10);
  auVar10._0_4_ = (uint)uVar2;
  auVar10._6_8_ = SUB148(auVar13 << 0x40,6);
  uVar3 = *(ulong *)(left + 4);
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar3;
  auVar5._12_2_ = (short)(uVar3 >> 0x30);
  auVar8._8_2_ = (short)(uVar3 >> 0x20);
  auVar8._0_8_ = uVar3;
  auVar8._10_4_ = auVar5._10_4_;
  auVar14._6_8_ = 0;
  auVar14._0_6_ = auVar8._8_6_;
  auVar11._4_2_ = (short)(uVar3 >> 0x10);
  auVar11._0_4_ = (uint)uVar3;
  auVar11._6_8_ = SUB148(auVar14 << 0x40,6);
  auVar16 = ZEXT416(((auVar5._10_4_ >> 0x10) + (auVar4._10_4_ >> 0x10) +
                     auVar11._4_4_ + auVar10._4_4_ +
                     auVar8._8_4_ + auVar7._8_4_ +
                     ((uint)uVar3 & 0xffff) + ((uint)uVar2 & 0xffff) +
                     (auVar6._10_4_ >> 0x10) +
                     (int)CONCAT82(SUB148(auVar12 << 0x40,6),(short)(uVar1 >> 0x10)) +
                     auVar9._8_4_ + (uint)(ushort)uVar1 + 6 >> 2) * 0xaaab >> 0x11);
  auVar16 = pshuflw(auVar16,auVar16,0);
  iVar15 = 8;
  do {
    *(long *)dst = auVar16._0_8_;
    dst = dst + stride;
    iVar15 = iVar15 + -1;
  } while (iVar15 != 0);
  return;
}

Assistant:

static inline void highbd_dc_predictor_rect(uint16_t *dst, ptrdiff_t stride,
                                            int bw, int bh,
                                            const uint16_t *above,
                                            const uint16_t *left, int bd,
                                            int shift1, uint32_t multiplier) {
  int sum = 0;
  (void)bd;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, HIGHBD_DC_SHIFT2);
  assert(expected_dc < (1 << bd));

  for (int r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}